

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall anon_unknown.dwarf_4ffb8::AndExpr::parse_term(AndExpr *this,Context *con)

{
  element_type *peVar1;
  int iVar2;
  long lVar3;
  ParsingState st;
  
  st.position.line = (con->position).line;
  st.position.col = (con->position).col;
  st.position.it.buffer._0_4_ = *(undefined4 *)&(con->position).it.buffer;
  st.position.it.buffer._4_4_ = *(undefined4 *)((long)&(con->position).it.buffer + 4);
  st.position.it.idx._0_4_ = (undefined4)(con->position).it.idx;
  st.position.it.idx._4_4_ = *(undefined4 *)((long)&(con->position).it.idx + 4);
  lVar3 = (long)(con->matches).
                super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(con->matches).
                super__Vector_base<(anonymous_namespace)::ParseMatch,_std::allocator<(anonymous_namespace)::ParseMatch>_>
                ._M_impl.super__Vector_impl_data._M_start;
  st.matches = lVar3 / 0x38;
  peVar1 = (this->super_UnaryExpr).expr.super_shared_ptr<pegmatite::Expr>.
           super___shared_ptr<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar2 = (*peVar1->_vptr_Expr[3])(peVar1,con,lVar3 % 0x38);
  pegmatite::Context::restore(con,&st);
  return SUB41(iVar2,0);
}

Assistant:

virtual bool parse_term(Context &con) const
	{
		ParsingState st(con);
		bool ok = expr->parse_term(con);
		con.restore(st);
		return ok;
	}